

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

u16 __thiscall moira::Moira::getIrqVector(Moira *this,u8 level)

{
  ushort uVar1;
  int iVar2;
  
  if (level < 8) {
    switch(this->irqMode) {
    case AUTO:
      uVar1 = (ushort)(level | 0x18);
      break;
    case USER:
      iVar2 = (*this->_vptr_Moira[9])(this,(ulong)level);
      uVar1 = (ushort)iVar2 & 0xff;
      break;
    case SPURIOUS:
      uVar1 = 0x18;
      break;
    case UNINITIALIZED:
      uVar1 = 0xf;
      break;
    default:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                    ,0x353,"u16 moira::Moira::getIrqVector(u8) const");
    }
    return uVar1;
  }
  __assert_fail("level < 8",
                "/workspace/llm4binary/github/license_c_cmakelists/dirkwhoffmann[P]Moira/Moira/Moira.cpp"
                ,0x349,"u16 moira::Moira::getIrqVector(u8) const");
}

Assistant:

u16
Moira::getIrqVector(u8 level) const {

    assert(level < 8);

    switch (irqMode) {

        case IrqMode::AUTO:          return 24 + level;
        case IrqMode::USER:          return readIrqUserVector(level) & 0xFF;
        case IrqMode::SPURIOUS:      return 24;
        case IrqMode::UNINITIALIZED: return 15;

        default:
            fatalError;
    }
}